

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# processes.cxx
# Opt level: O2

void __thiscall Poisson::setParameter(Poisson *this,string *name,string *value)

{
  bool bVar1;
  stringstream parameter;
  stringstream local_1a0 [16];
  ostream local_190;
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::operator<<(&local_190,(string *)value);
  bVar1 = std::operator==(name,"rate");
  if (bVar1) {
    std::istream::_M_extract<double>((double *)local_1a0);
    this->poissonRate =
         ((this->super_StochasticEventGenerator).super_StochasticVariable.super_StochasticProcess.
          super_TimeDependent.xTime)->dt * this->poissonRate;
  }
  else {
    Parametric::setParameter((Parametric *)this,name,value);
  }
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return;
}

Assistant:

void Poisson::setParameter(const string& name, const string& value)
{
	stringstream parameter;
	parameter << value;
	if (name=="rate") {
		parameter >> poissonRate;
		poissonRate *= xTime->dt;
	}
	else
		StochasticEventGenerator::setParameter( name, value );
}